

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildtexture.cpp
# Opt level: O1

void __thiscall
FBuildTexture::FBuildTexture
          (FBuildTexture *this,int tilenum,BYTE *pixels,int width,int height,int left,int top)

{
  FTexture::FTexture(&this->super_FTexture,(char *)0x0,-1);
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FBuildTexture_0070dd70;
  this->Pixels = pixels;
  this->Spans = (Span **)0x0;
  (this->super_FTexture).Width = (WORD)width;
  (this->super_FTexture).Height = (WORD)height;
  (this->super_FTexture).LeftOffset = (SWORD)left;
  (this->super_FTexture).TopOffset = (SWORD)top;
  FTexture::CalcBitSize(&this->super_FTexture);
  FString::Format(&(this->super_FTexture).Name,"BTIL%04d",tilenum);
  (this->super_FTexture).UseType = '\x05';
  return;
}

Assistant:

FBuildTexture::FBuildTexture (int tilenum, const BYTE *pixels, int width, int height, int left, int top)
: Pixels (pixels), Spans (NULL)
{
	Width = width;
	Height = height;
	LeftOffset = left;
	TopOffset = top;
	CalcBitSize ();
	Name.Format("BTIL%04d", tilenum);
	UseType = TEX_Build;
}